

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O0

void __thiscall PvrV3Header::PvrV3Header(PvrV3Header *this)

{
  PvrV3Header *this_local;
  
  IHeader::IHeader(&this->super_IHeader);
  (this->super_IHeader)._vptr_IHeader = (_func_int **)&PTR_LoadHeader_0015dc80;
  Impl::Impl(&this->impl_);
  return;
}

Assistant:

std::vector<std::string> ToStringArray() {
    std::vector<std::string> output;
    const auto& impl(this->impl_);
    // If the last 16-bits are empty, it's a compressed format
    if(impl.pixel_format.u32[1] == 0) {
        output.push_back(PvrV3Info::compressed_format_names.find(impl.pixel_format.u8[0])->second);
      for(unsigned int index = 0; index < 8; index++)
        output.push_back(c_empty_string);
      }
    else {
      output.push_back(c_empty_string);
      // Channel names
      for(unsigned int index = 0; index < 4; index++) {
        // Convert unsigned int pulled from the header into a literal character
        char value_char(impl.pixel_format.u8[index]);
        if(!value_char) value_char = c_empty_string[0];
        const std::string value((char*)&value_char,1);
        output.push_back(value);
      }
      // Bits per-pixel
      for(unsigned int index = 4; index < 8; index++)
        if(impl.pixel_format.u8[index]==0)
          output.push_back(c_empty_string);
        else
          output.push_back(std::to_string(impl.pixel_format.u8[index]));
    }
    output.push_back(PvrV3Info::color_space_names.find(impl.color_space)->second);
    output.push_back(PvrV3Info::variable_type_names.find(impl.channel_type)->second);
    output.push_back(std::to_string(impl.width));
    output.push_back(std::to_string(impl.height));
    output.push_back(std::to_string(impl.depth));
    output.push_back(std::to_string(impl.num_surfaces));
    output.push_back(std::to_string(impl.num_faces));
    output.push_back(std::to_string(impl.mip_map_count));
    output.push_back(std::to_string(impl.flags));
    output.push_back(std::to_string(impl.meta_data_size));
    return output;
  }